

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseNCName(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlChar **ppxVar2;
  byte bVar3;
  byte *name;
  byte *pbVar4;
  xmlChar *pxVar5;
  xmlParserInputPtr pxVar6;
  xmlChar *pxVar7;
  uint c;
  int iVar8;
  int iVar9;
  undefined8 in_RAX;
  xmlChar *pxVar10;
  byte *pbVar11;
  int iVar12;
  undefined8 uStack_38;
  
  name = ctxt->input->cur;
  pbVar4 = ctxt->input->end;
  if ((byte)((*name & 0xdf) + 0xbf) < 0x1a) {
    if (pbVar4 <= name) goto LAB_0016e655;
  }
  else if (*name != 0x5f || pbVar4 <= name) goto LAB_0016e655;
  iVar8 = 1;
  pbVar11 = name;
  do {
    iVar12 = iVar8;
    pbVar11 = pbVar11 + 1;
    bVar3 = *pbVar11;
    if (((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) &&
       ((0x32 < bVar3 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar3 - 0x2d) & 0x3f) & 1) == 0))))
    break;
    iVar8 = iVar12 + 1;
  } while (pbVar11 < pbVar4);
  if ('\0' < (char)bVar3 && pbVar11 < pbVar4) {
    if ((iVar12 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
      pxVar10 = xmlDictLookup(ctxt->dict,name,iVar12);
      pxVar6 = ctxt->input;
      pxVar6->cur = pbVar11;
      piVar1 = &pxVar6->col;
      *piVar1 = *piVar1 + iVar12;
      if (pxVar10 == (xmlChar *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        return (xmlChar *)0x0;
      }
      return pxVar10;
    }
LAB_0016e81e:
    xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
    return (xmlChar *)0x0;
  }
LAB_0016e655:
  uStack_38 = in_RAX;
  if ((ctxt->progressive == 0) && ((long)pbVar4 - (long)name < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar10 = ctxt->input->cur;
  pxVar5 = ctxt->input->base;
  c = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
  if ((0x3e < c) || ((0x4000800100000000U >> ((ulong)c & 0x3f) & 1) == 0)) {
    iVar8 = xmlIsNameStartChar(ctxt,c);
    if (c == 0x3a) {
      return (xmlChar *)0x0;
    }
    if (iVar8 == 0) {
      return (xmlChar *)0x0;
    }
    iVar8 = 0;
    while( true ) {
      iVar12 = 0;
      do {
        if ((((c < 0x3f) && ((0x4000800100000000U >> ((ulong)c & 0x3f) & 1) != 0)) ||
            (iVar9 = xmlIsNameChar(ctxt,c), c == 0x3a)) || (iVar9 == 0)) {
          if ((iVar8 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
            pxVar10 = xmlDictLookup(ctxt->dict,ctxt->input->base + ((long)pxVar10 - (long)pxVar5),
                                    iVar8);
            return pxVar10;
          }
          goto LAB_0016e81e;
        }
        if (iVar12 < 0x65) {
          iVar12 = iVar12 + 1;
        }
        else {
          if ((50000 < iVar8) && ((ctxt->options & 0x80000) == 0)) goto LAB_0016e81e;
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar12 = 0;
          if (ctxt->instate == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
        }
        pxVar6 = ctxt->input;
        if (*pxVar6->cur == '\n') {
          pxVar6->line = pxVar6->line + 1;
          pxVar6->col = 1;
        }
        else {
          pxVar6->col = pxVar6->col + 1;
        }
        iVar8 = iVar8 + uStack_38._4_4_;
        pxVar6->cur = pxVar6->cur + uStack_38._4_4_;
        c = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
      } while (c != 0);
      pxVar6 = ctxt->input;
      pxVar7 = pxVar6->cur;
      pxVar6->cur = pxVar7 + -(long)uStack_38._4_4_;
      if ((ctxt->progressive == 0) &&
         ((long)pxVar6->end - (long)(pxVar7 + -(long)uStack_38._4_4_) < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (ctxt->instate == XML_PARSER_EOF) break;
      ppxVar2 = &ctxt->input->cur;
      *ppxVar2 = *ppxVar2 + uStack_38._4_4_;
      c = xmlCurrentChar(ctxt,(int *)((long)&uStack_38 + 4));
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlParseNCName(xmlParserCtxtPtr ctxt) {
    const xmlChar *in, *e;
    const xmlChar *ret;
    int count = 0;

#ifdef DEBUG
    nbParseNCName++;
#endif

    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->input->cur;
    e = ctxt->input->end;
    if ((((*in >= 0x61) && (*in <= 0x7A)) ||
	 ((*in >= 0x41) && (*in <= 0x5A)) ||
	 (*in == '_')) && (in < e)) {
	in++;
	while ((((*in >= 0x61) && (*in <= 0x7A)) ||
	        ((*in >= 0x41) && (*in <= 0x5A)) ||
	        ((*in >= 0x30) && (*in <= 0x39)) ||
	        (*in == '_') || (*in == '-') ||
	        (*in == '.')) && (in < e))
	    in++;
	if (in >= e)
	    goto complex;
	if ((*in > 0) && (*in < 0x80)) {
	    count = in - ctxt->input->cur;
            if ((count > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                return(NULL);
            }
	    ret = xmlDictLookup(ctxt->dict, ctxt->input->cur, count);
	    ctxt->input->cur = in;
	    ctxt->input->col += count;
	    if (ret == NULL) {
	        xmlErrMemory(ctxt, NULL);
	    }
	    return(ret);
	}
    }
complex:
    return(xmlParseNCNameComplex(ctxt));
}